

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O2

void test_divceil<std::vector<int,std::allocator<int>>,signed_char>
               (vector<int,_std::allocator<int>_> *values,char divisor,size_t attempt_count)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  bool bVar6;
  
  iVar5 = 0;
  lVar2 = std::chrono::_V2::steady_clock::now();
  while (bVar6 = attempt_count != 0, attempt_count = attempt_count - 1, bVar6) {
    iVar1 = std::
            accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int,test_divceil<std::vector<int,std::allocator<int>>,signed_char>(std::vector<int,std::allocator<int>>const&,signed_char,unsigned_long)::_lambda(auto:1,auto:2)_1_>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish,0,(anon_class_1_1_e7267f7e)divisor);
    iVar5 = iVar5 + iVar1;
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  poVar4 = (ostream *)std::ostream::operator<<(&std::clog,iVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_1fcde);
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}